

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformGradient.cpp
# Opt level: O3

void __thiscall OpenMD::UniformGradient::initialize(UniformGradient *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint i;
  long lVar7;
  Mat3x3d *pMVar8;
  uint i_2;
  uint j;
  long lVar9;
  Globals *pGVar10;
  double tmp;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  vector<double,_std::allocator<double>_> d1;
  vector<double,_std::allocator<double>_> local_38;
  
  pGVar10 = this->simParams;
  bVar1 = (pGVar10->UniformGradientDirection1).super_ParameterBase.empty_;
  if (bVar1 == false) {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_38,&(pGVar10->UniformGradientDirection1).data_);
    if ((long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0x18) {
      snprintf(painCave.errMsg,2000,
               "uniformGradientDirection1: Incorrect number of parameters\n\tspecified. There should be 3 parameters, but %zu were\n\tspecified.\n"
              );
      painCave.isFatal = 1;
      simError();
    }
    (this->a_).super_Vector<double,_3U>.data_[0] =
         *local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
    (this->a_).super_Vector<double,_3U>.data_[1] =
         local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    (this->a_).super_Vector<double,_3U>.data_[2] =
         local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[2];
    dVar14 = 0.0;
    lVar7 = 0;
    do {
      dVar12 = (this->a_).super_Vector<double,_3U>.data_[lVar7];
      dVar14 = dVar14 + dVar12 * dVar12;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    lVar7 = 0;
    do {
      (this->a_).super_Vector<double,_3U>.data_[lVar7] =
           (this->a_).super_Vector<double,_3U>.data_[lVar7] / dVar14;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pGVar10 = this->simParams;
  }
  bVar2 = (pGVar10->UniformGradientDirection2).super_ParameterBase.empty_;
  if (bVar2 == false) {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_38,&(pGVar10->UniformGradientDirection2).data_);
    if ((long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0x18) {
      snprintf(painCave.errMsg,2000,
               "uniformGradientDirection2: Incorrect number of parameters\n\tspecified. There should be 3 parameters, but %zu were\n\tspecified.\n"
              );
      painCave.isFatal = 1;
      simError();
    }
    (this->b_).super_Vector<double,_3U>.data_[0] =
         *local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
    (this->b_).super_Vector<double,_3U>.data_[1] =
         local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    (this->b_).super_Vector<double,_3U>.data_[2] =
         local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[2];
    dVar14 = 0.0;
    lVar7 = 0;
    do {
      dVar12 = (this->b_).super_Vector<double,_3U>.data_[lVar7];
      dVar14 = dVar14 + dVar12 * dVar12;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    lVar7 = 0;
    do {
      (this->b_).super_Vector<double,_3U>.data_[lVar7] =
           (this->b_).super_Vector<double,_3U>.data_[lVar7] / dVar14;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pGVar10 = this->simParams;
  }
  bVar3 = (pGVar10->UniformGradientStrength).super_ParameterBase.empty_;
  if (((bVar3 == false) && (this->g_ = (pGVar10->UniformGradientStrength).data_, bVar1 == false)) &&
     (bVar2 == false)) {
    this->doUniformGradient = true;
    dVar14 = 0.0;
    lVar7 = -0x18;
    do {
      dVar14 = dVar14 + *(double *)((long)(this->b_).super_Vector<double,_3U>.data_ + lVar7) *
                        *(double *)((long)(&this->b_ + 1) + lVar7);
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0);
    this->cpsi_ = dVar14;
    dVar12 = (this->a_).super_Vector<double,_3U>.data_[0];
    dVar15 = (this->b_).super_Vector<double,_3U>.data_[0];
    dVar14 = dVar14 / -3.0;
    dVar13 = dVar12 * dVar15 + dVar14;
    pMVar8 = &this->Grad_;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         dVar13 + dVar13;
    dVar13 = (this->b_).super_Vector<double,_3U>.data_[1];
    dVar4 = (this->b_).super_Vector<double,_3U>.data_[2];
    dVar5 = (this->a_).super_Vector<double,_3U>.data_[1];
    dVar6 = (this->a_).super_Vector<double,_3U>.data_[2];
    dVar11 = dVar12 * dVar13 + dVar15 * dVar5;
    dVar12 = dVar12 * dVar4 + dVar15 * dVar6;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
         dVar11;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
         dVar12;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
         dVar11;
    dVar15 = dVar5 * dVar13 + dVar14;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
         dVar15 + dVar15;
    dVar15 = dVar5 * dVar4 + dVar13 * dVar6;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
         dVar15;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
         dVar12;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
         dVar15;
    dVar14 = dVar4 * dVar6 + dVar14;
    (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
         dVar14 + dVar14;
    dVar14 = this->g_;
    lVar7 = 0;
    do {
      lVar9 = 0;
      do {
        (pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar9] =
             (pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
             [lVar9] * dVar14 * 0.5;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar7 = lVar7 + 1;
      pMVar8 = (Mat3x3d *)
               ((pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar7 != 3);
  }
  else {
    if (bVar1 != false) {
      builtin_strncpy(painCave.errMsg + 0x20,"Direction1 not specified.\n",0x1b);
      builtin_strncpy(painCave.errMsg + 0x10," uniformGradient",0x10);
      builtin_strncpy(painCave.errMsg,"UniformGradient:",0x10);
      painCave.isFatal = 1;
      simError();
    }
    if (bVar2 != false) {
      builtin_strncpy(painCave.errMsg + 0x20,"Direction2 not specified.\n",0x1b);
      builtin_strncpy(painCave.errMsg + 0x10," uniformGradient",0x10);
      builtin_strncpy(painCave.errMsg,"UniformGradient:",0x10);
      painCave.isFatal = 1;
      simError();
    }
    if (bVar3 != false) {
      builtin_strncpy(painCave.errMsg + 0x20,"Strength not specified.\n",0x19);
      builtin_strncpy(painCave.errMsg + 0x10," uniformGradient",0x10);
      builtin_strncpy(painCave.errMsg,"UniformGradient:",0x10);
      painCave.isFatal = 1;
      simError();
    }
  }
  if ((((this->super_ForceModifier).info_)->sman_->atomStorageLayout_ & 0x40) != 0) {
    this->doParticlePot = true;
  }
  this->initialized = true;
  return;
}

Assistant:

void UniformGradient::initialize() {
    bool haveA = false;
    bool haveB = false;
    bool haveG = false;

    if (simParams->haveUniformGradientDirection1()) {
      std::vector<RealType> d1 = simParams->getUniformGradientDirection1();
      if (d1.size() != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "uniformGradientDirection1: Incorrect number of parameters\n"
                 "\tspecified. There should be 3 parameters, but %zu were\n"
                 "\tspecified.\n",
                 d1.size());
        painCave.isFatal = 1;
        simError();
      }
      a_.x() = d1[0];
      a_.y() = d1[1];
      a_.z() = d1[2];

      a_.normalize();
      haveA = true;
    }

    if (simParams->haveUniformGradientDirection2()) {
      std::vector<RealType> d2 = simParams->getUniformGradientDirection2();
      if (d2.size() != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "uniformGradientDirection2: Incorrect number of parameters\n"
                 "\tspecified. There should be 3 parameters, but %zu were\n"
                 "\tspecified.\n",
                 d2.size());
        painCave.isFatal = 1;
        simError();
      }
      b_.x() = d2[0];
      b_.y() = d2[1];
      b_.z() = d2[2];

      b_.normalize();
      haveB = true;
    }

    if (simParams->haveUniformGradientStrength()) {
      g_    = simParams->getUniformGradientStrength();
      haveG = true;
    }

    if (haveA && haveB && haveG) {
      doUniformGradient = true;
      cpsi_             = dot(a_, b_);

      Grad_(0, 0) = 2.0 * (a_.x() * b_.x() - cpsi_ / 3.0);
      Grad_(0, 1) = a_.x() * b_.y() + a_.y() * b_.x();
      Grad_(0, 2) = a_.x() * b_.z() + a_.z() * b_.x();
      Grad_(1, 0) = Grad_(0, 1);
      Grad_(1, 1) = 2.0 * (a_.y() * b_.y() - cpsi_ / 3.0);
      Grad_(1, 2) = a_.y() * b_.z() + a_.z() * b_.y();
      Grad_(2, 0) = Grad_(0, 2);
      Grad_(2, 1) = Grad_(1, 2);
      Grad_(2, 2) = 2.0 * (a_.z() * b_.z() - cpsi_ / 3.0);

      Grad_ *= g_ / 2.0;

    } else {
      if (!haveA) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UniformGradient: uniformGradientDirection1 not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveB) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UniformGradient: uniformGradientDirection2 not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveG) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UniformGradient: uniformGradientStrength not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    int storageLayout_ = info_->getSnapshotManager()->getAtomStorageLayout();
    if (storageLayout_ & DataStorage::dslParticlePot) doParticlePot = true;
    initialized = true;
  }